

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void Blindf_off(obj *otmp,boolean deliberate)

{
  bool bVar1;
  bool bVar2;
  boolean changed;
  boolean was_blind;
  boolean deliberate_local;
  obj *otmp_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar2 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar2 = false;
    if (ublindf != (obj *)0x0) {
      bVar2 = ublindf->oartifact == '\x1d';
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  bVar1 = false;
  violated(4);
  takeoff_mask = takeoff_mask & 0xfff7ffff;
  setworn((obj *)0x0,(long)otmp->owornmask);
  off_msg(otmp,deliberate);
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    bVar1 = bVar2;
    if (bVar2) {
      pline("You can see again.");
    }
  }
  else if (bVar2) {
    if (otmp->otyp != 0xed) {
      pline("You still cannot see.");
    }
  }
  else {
    bVar1 = true;
    pline("You can\'t see anything now!");
    if (uball != (obj *)0x0) {
      set_bc(0);
    }
  }
  if (bVar1) {
    if ((((((u.uprops[0x19].intrinsic != 0) || (u.uprops[0x19].extrinsic != 0)) ||
          (youmonst.data == mons + 0x1e)) ||
         ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))) &&
        (u.uprops[0x19].blocked == 0)) ||
       (((u.uprops[0x40].intrinsic != 0 || (u.uprops[0x40].extrinsic != 0)) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)))) {
      see_monsters();
    }
    vision_full_recalc = '\x01';
    iflags.botl = '\x01';
  }
  return;
}

Assistant:

void Blindf_off(struct obj *otmp, boolean deliberate)
{
	boolean was_blind = Blind, changed = FALSE;

	violated(CONDUCT_BLINDFOLDED);
	takeoff_mask &= ~W_TOOL;
	setworn(NULL, otmp->owornmask);
	off_msg(otmp, deliberate);

	if (Blind) {
	    if (was_blind) {
		/* "still cannot see" makes no sense when removing lenses
		   since they can't have been the cause of your blindness */
		if (otmp->otyp != LENSES)
		    pline("You still cannot see.");
	    } else {
		changed = TRUE;	/* !was_blind */
		/* "You were wearing the Eyes of the Overworld." */
		pline("You can't see anything now!");
		/* set ball&chain variables before the hero goes blind */
		if (Punished) set_bc(0);
	    }
	} else if (was_blind) {
	    changed = TRUE;	/* !Blind */
	    pline("You can see again.");
	}
	if (changed) {
	    /* blindness has just been toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	    vision_full_recalc = 1;	/* recalc vision limits */
	    iflags.botl = 1;
	}
}